

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

uint __thiscall Model::texture_from_file(Model *this,char *file_path)

{
  ostream *this_00;
  char *filename;
  stbi_uc *retval_from_stbi_load;
  GLint local_b8;
  GLenum format;
  uchar *img_data;
  int nr_channels;
  int img_height;
  int img_width;
  uint texture;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string file_name;
  char *file_path_local;
  Model *this_local;
  
  file_name.field_2._8_8_ = file_path;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,file_path,&local_41);
  std::allocator<char>::~allocator(&local_41);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&img_width,
                 &this->directory,'/');
  std::operator+(&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&img_width,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::__cxx11::string::operator=((string *)local_40,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&img_width);
  this_00 = std::operator<<((ostream *)&std::cout,(string *)local_40);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  (*glad_glGenTextures)(1,(GLuint *)&img_height);
  filename = (char *)std::__cxx11::string::c_str();
  retval_from_stbi_load =
       stbi_load(filename,&nr_channels,(int *)((long)&img_data + 4),(int *)&img_data,0);
  if (retval_from_stbi_load == (stbi_uc *)0x0) {
    std::operator<<((ostream *)&std::cerr,"Failed to load image data!\n");
    stbi_image_free((void *)0x0);
    this_local._4_4_ = 1;
  }
  else {
    local_b8 = 0x1907;
    if ((int)img_data == 1) {
      local_b8 = 0x1903;
    }
    else if ((int)img_data == 4) {
      local_b8 = 0x1908;
    }
    (*glad_glBindTexture)(0xde1,img_height);
    (*glad_glTexImage2D)
              (0xde1,0,local_b8,nr_channels,img_data._4_4_,0,local_b8,0x1401,retval_from_stbi_load);
    (*glad_glGenerateMipmap)(0xde1);
    (*glad_glTexParameteri)(0xde1,0x2802,0x2901);
    (*glad_glTexParameteri)(0xde1,0x2803,0x2901);
    (*glad_glTexParameteri)(0xde1,0x2801,0x2703);
    (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
    stbi_image_free(retval_from_stbi_load);
    this_local._4_4_ = img_height;
  }
  std::__cxx11::string::~string((string *)local_40);
  return this_local._4_4_;
}

Assistant:

unsigned int Model::texture_from_file(const char *file_path) {
  std::string file_name = std::string(file_path);
  file_name = directory + '/' + file_name;
  std::cout << file_name << std::endl;

  unsigned int texture;
  glGenTextures(1, &texture);

  // rgb image has 3 channels : r,g,b
  int img_width, img_height, nr_channels;
  unsigned char *img_data = stbi_load(file_name.c_str(), &img_width,
                                      &img_height, &nr_channels, 0);

  if (!img_data) {
    std::cerr << "Failed to load image data!\n";
    stbi_image_free(img_data);
    return 1;
  }

  GLenum format = GL_RGB;
  if (nr_channels == 1)
    format = GL_RED;
  else if (nr_channels == 4)
    format = GL_RGBA;

  glBindTexture(GL_TEXTURE_2D, texture);
  glTexImage2D(GL_TEXTURE_2D, 0, format, img_width, img_height, 0, format,
               GL_UNSIGNED_BYTE, img_data);
  glGenerateMipmap(GL_TEXTURE_2D); // only base mipmap generated since

  // set repeeat parameters for the texture on S and T axes
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);

  // set filtering methods to mip maps (maginification/minification)
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,
                  GL_LINEAR_MIPMAP_LINEAR);
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,
                  GL_LINEAR); // come back later, parameter might be mistake

  stbi_image_free(img_data);
  return texture;
}